

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxkbcommon.cpp
# Opt level: O2

QList<QKeyCombination> *
QXkbCommon::possibleKeyCombinations
          (QList<QKeyCombination> *__return_storage_ptr__,xkb_state *state,QKeyEvent *event,
          bool superAsMeta,bool hyperAsMeta)

{
  xkb_keycode_t code;
  uint uVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  KeyboardModifiers KVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  int iVar10;
  xkb_keysym_t xVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  undefined8 uVar16;
  _Head_base<0UL,_xkb_state_*,_false> state_00;
  reference pQVar17;
  QLoggingCategory *pQVar18;
  QDebug *this;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  long lVar22;
  uint i;
  long lVar23;
  QFlagsStorage<Qt::KeyboardModifier> modifiers;
  long in_FS_OFFSET;
  undefined1 auVar24 [16];
  add_const_t<QList<QKeyCombination>_> *__range3;
  QKeyCombination local_68;
  undefined8 local_64;
  undefined8 uStack_5c;
  undefined4 local_54;
  char *local_50;
  QDebug local_48;
  unique_ptr<xkb_state,_QXkbCommon::XKBStateDeleter> local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QKeyCombination *)0x0;
  code = event->m_scanCode;
  if (code != 0) {
    KVar5 = QKeyEvent::modifiers(event);
    uVar16 = xkb_state_get_keymap(state);
    state_00._M_head_impl = (xkb_state *)xkb_state_new(uVar16);
    local_40._M_t.super___uniq_ptr_impl<xkb_state,_QXkbCommon::XKBStateDeleter>._M_t.
    super__Tuple_impl<0UL,_xkb_state_*,_QXkbCommon::XKBStateDeleter>.
    super__Head_base<0UL,_xkb_state_*,_false>._M_head_impl =
         (__uniq_ptr_data<xkb_state,_QXkbCommon::XKBStateDeleter,_true,_true>)
         (__uniq_ptr_data<xkb_state,_QXkbCommon::XKBStateDeleter,_true,_true>)state_00._M_head_impl;
    if ((tuple<xkb_state_*,_QXkbCommon::XKBStateDeleter>)state_00._M_head_impl ==
        (_Head_base<0UL,_xkb_state_*,_false>)0x0) {
      pQVar18 = QtPrivateLogging::lcQpaKeyMapper();
      if (((pQVar18->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
        local_50 = pQVar18->name;
        local_68.combination = 2;
        local_64 = 0;
        uStack_5c = 0;
        local_54 = 0;
        QMessageLogger::warning();
        this = QDebug::operator<<(&local_48,
                                  "static QList<QKeyCombination> QXkbCommon::possibleKeyCombinations(xkb_state *, const QKeyEvent *, bool, bool)"
                                 );
        QDebug::operator<<(this,"failed to compile xkb keymap");
        QDebug::~QDebug(&local_48);
      }
    }
    else {
      uVar6 = xkb_state_serialize_layout(state,0x40);
      uVar7 = xkb_state_serialize_mods(state,2);
      uVar8 = xkb_state_serialize_mods(state,4);
      uVar9 = xkb_state_serialize_mods(state,1);
      xkb_state_update_mask(state_00._M_head_impl,uVar9,uVar7,uVar8,0,0,uVar6);
      iVar10 = xkb_state_key_get_layout(state_00._M_head_impl,code);
      if ((iVar10 == -1) ||
         (iVar10 = xkb_state_key_get_level(state_00._M_head_impl,code,iVar10), iVar10 + 1U < 3)) {
        xkb_state_update_mask(state_00._M_head_impl,0,uVar7,uVar8,0,0,uVar6);
      }
      xVar11 = xkb_state_key_get_one_sym(state_00._M_head_impl,code);
      if (xVar11 != 0) {
        KVar5.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
        super_QFlagsStorage<Qt::KeyboardModifier>.i =
             (QFlagsStorageHelper<Qt::KeyboardModifier,_4>)
             ((uint)KVar5.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
                    super_QFlagsStorage<Qt::KeyboardModifier>.i & 0x9fffffff);
        uVar12 = keysymToQtKey_internal
                           (xVar11,KVar5,state_00._M_head_impl,code,superAsMeta,hyperAsMeta);
        if (uVar12 != 0) {
          local_68.combination =
               uVar12 + (int)KVar5.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
                             super_QFlagsStorage<Qt::KeyboardModifier>.i;
          QList<QKeyCombination>::emplaceBack<QKeyCombination>(__return_storage_ptr__,&local_68);
        }
        bVar2 = xkb_keymap_mod_get_index(uVar16,"Shift");
        bVar3 = xkb_keymap_mod_get_index(uVar16,"Alt");
        bVar4 = xkb_keymap_mod_get_index(uVar16,"Control");
        uVar13 = xkb_keymap_mod_get_index(uVar16,"Meta");
        pQVar17 = (reference)(ulong)(uVar12 - 0x20);
        for (lVar23 = 1; lVar23 != 9; lVar23 = lVar23 + 1) {
          uVar15 = ModsTbl[lVar23].super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
                   super_QFlagsStorage<Qt::KeyboardModifier>.i;
          if ((uVar15 & ~(uint)KVar5.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
                               super_QFlagsStorage<Qt::KeyboardModifier>.i) == 0) {
            if (lVar23 == 8) {
              if (uVar12 - 0x20 < 0xe0) goto LAB_005a5fea;
              xVar11 = lookupLatinKeysym(state,code);
              pQVar17 = (reference)(ulong)xVar11;
            }
            else {
              auVar24._0_4_ = -(uint)((uVar15 & 0x10000000) == 0);
              auVar24._4_4_ = -(uint)((uVar15 & 0x4000000) == 0);
              auVar24._8_4_ = -(uint)((uVar15 & 0x2000000) == 0);
              auVar24._12_4_ = -(uint)((uVar15 & 0x8000000) == 0);
              uVar14 = movmskps((int)pQVar17,auVar24);
              uVar1 = 1 << (bVar3 & 0x1f);
              if ((uVar14 & 8) != 0) {
                uVar1 = 0;
              }
              uVar20 = 1 << (bVar2 & 0x1f);
              if ((uVar14 & 4) != 0) {
                uVar20 = 0;
              }
              uVar19 = 1 << (bVar4 & 0x1f);
              if ((uVar14 & 2) != 0) {
                uVar19 = 0;
              }
              uVar21 = 1 << ((byte)uVar13 & 0x1f);
              if ((uVar14 & 1) != 0) {
                uVar21 = 0;
              }
              if (0x1f < uVar13) {
                uVar21 = 0;
              }
              xkb_state_update_mask
                        (state_00._M_head_impl,uVar21 | uVar19 | uVar20 | uVar1,uVar7,uVar8,0,0,
                         uVar6);
              pQVar17 = (reference)xkb_state_key_get_one_sym(state_00._M_head_impl,code);
            }
            if ((xkb_keysym_t)pQVar17 != 0) {
              modifiers.i = ~uVar15 & (uint)KVar5.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>
                                            .super_QFlagsStorage<Qt::KeyboardModifier>.i;
              uVar15 = keysymToQtKey_internal
                                 ((xkb_keysym_t)pQVar17,(KeyboardModifiers)modifiers.i,
                                  state_00._M_head_impl,code,superAsMeta,hyperAsMeta);
              pQVar17 = (reference)(ulong)uVar15;
              if (uVar15 != uVar12 && uVar15 != 0) {
                lVar22 = 0;
                do {
                  if ((__return_storage_ptr__->d).size << 2 == lVar22) {
                    local_68.combination = uVar15 + modifiers.i;
                    pQVar17 = QList<QKeyCombination>::emplaceBack<QKeyCombination>
                                        (__return_storage_ptr__,&local_68);
                    break;
                  }
                  uVar1 = *(uint *)((long)&((__return_storage_ptr__->d).ptr)->combination + lVar22);
                  lVar22 = lVar22 + 4;
                } while (((uVar1 & 0x1ffffff) != uVar15) ||
                        ((uVar1 & modifiers.i & 0x9e000000) != modifiers.i));
              }
            }
          }
LAB_005a5fea:
        }
      }
    }
    std::unique_ptr<xkb_state,_QXkbCommon::XKBStateDeleter>::~unique_ptr(&local_40);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QList<QKeyCombination> QXkbCommon::possibleKeyCombinations(xkb_state *state, const QKeyEvent *event,
                                    bool superAsMeta, bool hyperAsMeta)
{
    QList<QKeyCombination> result;
    quint32 keycode = event->nativeScanCode();
    if (!keycode)
        return result;

    Qt::KeyboardModifiers modifiers = event->modifiers();
    xkb_keymap *keymap = xkb_state_get_keymap(state);
    // turn off the modifier bits which doesn't participate in shortcuts
    Qt::KeyboardModifiers notNeeded = Qt::KeypadModifier | Qt::GroupSwitchModifier;
    modifiers &= ~notNeeded;
    // create a fresh kb state and test against the relevant modifier combinations
    ScopedXKBState scopedXkbQueryState(xkb_state_new(keymap));
    xkb_state *queryState = scopedXkbQueryState.get();
    if (!queryState) {
        qCWarning(lcQpaKeyMapper) << Q_FUNC_INFO << "failed to compile xkb keymap";
        return result;
    }
    // get kb state from the master state and update the temporary state
    xkb_layout_index_t lockedLayout = xkb_state_serialize_layout(state, XKB_STATE_LAYOUT_LOCKED);
    xkb_mod_mask_t latchedMods = xkb_state_serialize_mods(state, XKB_STATE_MODS_LATCHED);
    xkb_mod_mask_t lockedMods = xkb_state_serialize_mods(state, XKB_STATE_MODS_LOCKED);
    xkb_mod_mask_t depressedMods = xkb_state_serialize_mods(state, XKB_STATE_MODS_DEPRESSED);
    xkb_state_update_mask(queryState, depressedMods, latchedMods, lockedMods, 0, 0, lockedLayout);
    // handle shortcuts for level three and above
    xkb_layout_index_t layoutIndex = xkb_state_key_get_layout(queryState, keycode);
    xkb_level_index_t levelIndex = 0;
    if (layoutIndex != XKB_LAYOUT_INVALID) {
        levelIndex = xkb_state_key_get_level(queryState, keycode, layoutIndex);
        if (levelIndex == XKB_LEVEL_INVALID)
            levelIndex = 0;
    }
    if (levelIndex <= 1)
        xkb_state_update_mask(queryState, 0, latchedMods, lockedMods, 0, 0, lockedLayout);

    xkb_keysym_t sym = xkb_state_key_get_one_sym(queryState, keycode);
    if (sym == XKB_KEY_NoSymbol)
        return result;

    int baseQtKey = keysymToQtKey_internal(sym, modifiers, queryState, keycode, superAsMeta, hyperAsMeta);
    if (baseQtKey)
        result += QKeyCombination::fromCombined(baseQtKey + int(modifiers));

    xkb_mod_index_t shiftMod = xkb_keymap_mod_get_index(keymap, "Shift");
    xkb_mod_index_t altMod = xkb_keymap_mod_get_index(keymap, "Alt");
    xkb_mod_index_t controlMod = xkb_keymap_mod_get_index(keymap, "Control");
    xkb_mod_index_t metaMod = xkb_keymap_mod_get_index(keymap, "Meta");

    Q_ASSERT(shiftMod < 32);
    Q_ASSERT(altMod < 32);
    Q_ASSERT(controlMod < 32);

    xkb_mod_mask_t depressed;
    int qtKey = 0;
    // obtain a list of possible shortcuts for the given key event
    for (uint i = 1; i < sizeof(ModsTbl) / sizeof(*ModsTbl) ; ++i) {
        Qt::KeyboardModifiers neededMods = ModsTbl[i];
        if ((modifiers & neededMods) == neededMods) {
            if (i == 8) {
                if (isLatin1(baseQtKey))
                    continue;
                // add a latin key as a fall back key
                sym = lookupLatinKeysym(state, keycode);
            } else {
                depressed = 0;
                if (neededMods & Qt::AltModifier)
                    depressed |= (1 << altMod);
                if (neededMods & Qt::ShiftModifier)
                    depressed |= (1 << shiftMod);
                if (neededMods & Qt::ControlModifier)
                    depressed |= (1 << controlMod);
                if (metaMod < 32 && neededMods & Qt::MetaModifier)
                    depressed |= (1 << metaMod);
                xkb_state_update_mask(queryState, depressed, latchedMods, lockedMods, 0, 0, lockedLayout);
                sym = xkb_state_key_get_one_sym(queryState, keycode);
            }
            if (sym == XKB_KEY_NoSymbol)
                continue;

            Qt::KeyboardModifiers mods = modifiers & ~neededMods;
            qtKey = keysymToQtKey_internal(sym, mods, queryState, keycode, superAsMeta, hyperAsMeta);
            if (!qtKey || qtKey == baseQtKey)
                continue;

            // catch only more specific shortcuts, i.e. Ctrl+Shift+= also generates Ctrl++ and +,
            // but Ctrl++ is more specific than +, so we should skip the last one
            bool ambiguous = false;
            for (auto keyCombination : std::as_const(result)) {
                if (keyCombination.key() == qtKey
                    && (keyCombination.keyboardModifiers() & mods) == mods) {
                    ambiguous = true;
                    break;
                }
            }
            if (ambiguous)
                continue;

            result += QKeyCombination::fromCombined(qtKey + int(mods));
        }
    }

    return result;
}